

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O0

void __thiscall Analysis::FlowAnalysis_RHIC(Analysis *this)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  pretty_ostream *this_00;
  string *in_RDI;
  double dVar4;
  singleParticleSpectra **ipart_1;
  iterator __end1;
  iterator __begin1;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range1;
  int particle_monval;
  singleParticleSpectra **ipart;
  iterator __end2;
  iterator __begin2;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range2;
  int nev;
  int event_id;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  int flag_charge_dependence;
  int compute_correlation;
  ParameterReader paraRdr;
  particleSamples *in_stack_ffffffffffffe888;
  singleParticleSpectra *in_stack_ffffffffffffe890;
  ParameterReader *in_stack_ffffffffffffe898;
  ParameterReader *in_stack_ffffffffffffe8a0;
  undefined4 in_stack_ffffffffffffe8d8;
  undefined4 in_stack_ffffffffffffe8dc;
  ParameterReader *in_stack_ffffffffffffe8e0;
  ParameterReader *in_stack_ffffffffffffe8e8;
  string *message;
  string *in_stack_ffffffffffffe9a8;
  pretty_ostream *in_stack_ffffffffffffe9b0;
  undefined1 *in_stack_ffffffffffffe9c0;
  string *in_stack_ffffffffffffe9c8;
  ParameterReader *in_stack_ffffffffffffe9d0;
  __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
  local_12c8;
  undefined1 *local_12c0;
  allocator<char> local_12b1;
  string local_12b0 [32];
  ParameterReader local_1290;
  undefined1 *local_1260;
  allocator local_1251;
  string local_1250 [39];
  allocator local_1229;
  string local_1228 [32];
  int local_1208;
  undefined1 local_1201 [37];
  int local_11dc;
  int local_11d8;
  undefined1 local_11d1;
  shared_ptr<particleSamples> *in_stack_ffffffffffffee40;
  singleParticleSpectra *in_stack_ffffffffffffee48;
  allocator local_1191;
  string local_1190 [39];
  undefined1 local_1169;
  string local_1158 [32];
  void *local_1138;
  allocator local_1129;
  string local_1128 [39];
  undefined1 local_1101;
  string local_10f0 [32];
  void *local_10d0;
  allocator local_10c1;
  string local_10c0 [39];
  undefined1 local_1099;
  string local_1088 [32];
  void *local_1068;
  allocator local_1059;
  string local_1058 [39];
  undefined1 local_1031;
  string local_1020 [32];
  void *local_1000;
  allocator local_ff1;
  string local_ff0 [39];
  allocator local_fc9;
  string local_fc8 [39];
  undefined1 local_fa1;
  string local_f90 [32];
  void *local_f70;
  allocator local_f61;
  string local_f60 [39];
  undefined1 local_f39;
  undefined1 local_f38 [48];
  pretty_ostream *local_f08;
  allocator local_ef9;
  string local_ef8 [39];
  undefined1 local_ed1;
  undefined1 local_ed0 [16];
  string local_ec0 [32];
  string *local_ea0;
  undefined1 local_e91 [40];
  undefined1 local_e69;
  string local_e58 [32];
  void *local_e38;
  allocator local_e29;
  string local_e28 [39];
  undefined1 local_e01;
  string local_df0 [32];
  void *local_dd0;
  allocator local_dc1;
  string local_dc0 [39];
  undefined1 local_d99;
  string local_d88 [32];
  void *local_d68;
  allocator local_d59;
  string local_d58 [39];
  undefined1 local_d31;
  string local_d20 [32];
  void *local_d00;
  allocator local_cf1;
  string local_cf0 [39];
  allocator local_cc9;
  string local_cc8 [39];
  undefined1 local_ca1;
  string local_c90 [32];
  void *local_c70;
  allocator local_c61;
  string local_c60 [39];
  undefined1 local_c39;
  string local_c28 [32];
  void *local_c08;
  allocator local_bf9;
  string local_bf8 [39];
  undefined1 local_bd1;
  string local_bc0 [32];
  void *local_ba0;
  allocator local_b91;
  string local_b90 [39];
  undefined1 local_b69;
  string local_b58 [32];
  void *local_b38;
  allocator local_b29;
  string local_b28 [39];
  undefined1 local_b01;
  string local_af0 [32];
  void *local_ad0;
  allocator local_ac1;
  string local_ac0 [39];
  undefined1 local_a99;
  string local_a88 [32];
  void *local_a68;
  allocator local_a59;
  string local_a58 [39];
  allocator local_a31;
  string local_a30 [39];
  allocator local_a09;
  string local_a08 [39];
  allocator local_9e1;
  string local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [39];
  undefined1 local_991;
  string local_980 [32];
  void *local_960;
  allocator local_951;
  string local_950 [39];
  undefined1 local_929;
  string local_918 [32];
  void *local_8f8;
  allocator local_8e9;
  string local_8e8 [39];
  undefined1 local_8c1;
  string local_8b0 [32];
  void *local_890;
  allocator local_881;
  string local_880 [39];
  undefined1 local_859;
  string local_848 [32];
  void *local_828;
  allocator local_819;
  string local_818 [39];
  undefined1 local_7f1;
  string local_7e0 [32];
  void *local_7c0;
  shared_ptr<RandomUtil::Random> *in_stack_fffffffffffff848;
  string *in_stack_fffffffffffff850;
  ParameterReader *in_stack_fffffffffffff858;
  singleParticleSpectra *in_stack_fffffffffffff860;
  string local_778 [32];
  void *local_758;
  allocator local_749;
  string local_748 [39];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [39];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  undefined1 local_659;
  string local_648 [32];
  void *local_628;
  allocator local_619;
  string local_618 [39];
  allocator local_5f1;
  string local_5f0 [39];
  undefined1 local_5c9;
  string local_5b8 [32];
  void *local_598;
  allocator local_589;
  string local_588 [39];
  allocator local_561;
  string local_560 [39];
  undefined1 local_539;
  string local_528 [32];
  void *local_508;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  undefined1 local_4a9;
  string local_498 [32];
  void *local_478;
  allocator local_469;
  string local_468 [39];
  allocator local_441;
  string local_440 [39];
  undefined1 local_419;
  string local_408 [32];
  void *local_3e8;
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  undefined1 local_361;
  string local_350 [32];
  void *local_330;
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  undefined1 local_231;
  string local_220 [32];
  void *local_200;
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [31];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  int local_a0;
  allocator local_99;
  string local_98 [55];
  allocator local_61;
  string local_60 [36];
  int local_3c;
  
  ParameterReader::ParameterReader(in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"compute_correlation",&local_61);
  dVar4 = ParameterReader::getVal
                    (in_stack_ffffffffffffe8e0,
                     (string *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
  iVar2 = (int)dVar4;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_3c = iVar2;
  if (iVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"compute_correlation",&local_99);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"flag_charge_dependence",&local_c1);
  dVar4 = ParameterReader::getVal
                    (in_stack_ffffffffffffe8e0,
                     (string *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
  iVar2 = (int)dVar4;
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_a0 = iVar2;
  if (iVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"flag_charge_dependence",&local_e9);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x19c083);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"particle_monval",&local_129);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"rap_type",&local_151);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"rapidity_distribution",&local_179);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"vn_rapidity_dis_pT_min",&local_1a1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"vn_rapidity_dis_pT_max",&local_1c9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"rapidityPTDistributionFlag",&local_1f1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  pvVar3 = operator_new(0x8b8);
  local_231 = 1;
  std::__cxx11::string::string(local_220,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_231 = 0;
  local_200 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19c3b8);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"particle_monval",&local_259);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"rap_type",&local_281);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"rapidity_distribution",&local_2a9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"vn_rapidity_dis_pT_min",&local_2d1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"vn_rapidity_dis_pT_max",&local_2f9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"rapidityPTDistributionFlag",&local_321);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pvVar3 = operator_new(0x8b8);
  local_361 = 1;
  std::__cxx11::string::string(local_350,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_361 = 0;
  local_330 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19c6ff);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"rapidityPTDistributionFlag",&local_389);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"rap_min",&local_3b1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"rap_max",&local_3d9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  pvVar3 = operator_new(0x8b8);
  local_419 = 1;
  std::__cxx11::string::string(local_408,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_419 = 0;
  local_3e8 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19c902);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"rap_min",&local_441);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"rap_max",&local_469);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  pvVar3 = operator_new(0x8b8);
  local_4a9 = 1;
  std::__cxx11::string::string(local_498,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_4a9 = 0;
  local_478 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19ca9e);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"rap_min",&local_4d1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"rap_max",&local_4f9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  pvVar3 = operator_new(0x8b8);
  local_539 = 1;
  std::__cxx11::string::string(local_528,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_539 = 0;
  local_508 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19cc3a);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"rap_min",&local_561);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"rap_max",&local_589);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  pvVar3 = operator_new(0x8b8);
  local_5c9 = 1;
  std::__cxx11::string::string(local_5b8,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_5c9 = 0;
  local_598 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19cdd6);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"rap_min",&local_5f1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"rap_max",&local_619);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  pvVar3 = operator_new(0x8b8);
  local_659 = 1;
  std::__cxx11::string::string(local_648,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_659 = 0;
  local_628 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19cf72);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_680,"vn_rapidity_dis_pT_min",&local_681);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"vn_rapidity_dis_pT_max",&local_6a9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"pidwithRapidityPTDistribution",&local_6d1);
  dVar4 = ParameterReader::getVal
                    (in_stack_ffffffffffffe8e8,(string *)in_stack_ffffffffffffe8e0,
                     (double)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  if ((dVar4 == 1.0) && (!NAN(dVar4))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6f8,"rapidityPTDistributionFlag",&local_6f9);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_6f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_720,"rap_type",&local_721);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_720);
    std::allocator<char>::~allocator((allocator<char> *)&local_721);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_748,"particle_monval",&local_749);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_748);
    std::allocator<char>::~allocator((allocator<char> *)&local_749);
    pvVar3 = operator_new(0x8b8);
    std::__cxx11::string::string(local_778,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_758 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19d2e3);
    std::__cxx11::string::~string(local_778);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffff850,"particle_monval",
               (allocator *)&stack0xfffffffffffff84f);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff850);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff84f);
    pvVar3 = operator_new(0x8b8);
    local_7f1 = 1;
    std::__cxx11::string::string(local_7e0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_7f1 = 0;
    local_7c0 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19d413);
    std::__cxx11::string::~string(local_7e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_818,"particle_monval",&local_819);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_818);
    std::allocator<char>::~allocator((allocator<char> *)&local_819);
    pvVar3 = operator_new(0x8b8);
    local_859 = 1;
    std::__cxx11::string::string(local_848,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_859 = 0;
    local_828 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19d543);
    std::__cxx11::string::~string(local_848);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_880,"particle_monval",&local_881);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_880);
    std::allocator<char>::~allocator((allocator<char> *)&local_881);
    pvVar3 = operator_new(0x8b8);
    local_8c1 = 1;
    std::__cxx11::string::string(local_8b0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_8c1 = 0;
    local_890 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19d673);
    std::__cxx11::string::~string(local_8b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8e8,"particle_monval",&local_8e9);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_8e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
    pvVar3 = operator_new(0x8b8);
    local_929 = 1;
    std::__cxx11::string::string(local_918,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_929 = 0;
    local_8f8 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19d7a3);
    std::__cxx11::string::~string(local_918);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_950,"particle_monval",&local_951);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_950);
    std::allocator<char>::~allocator((allocator<char> *)&local_951);
    pvVar3 = operator_new(0x8b8);
    local_991 = 1;
    std::__cxx11::string::string(local_980,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_991 = 0;
    local_960 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19d8d3);
    std::__cxx11::string::~string(local_980);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"rap_type",&local_9b9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e0,"rapidity_distribution",&local_9e1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a08,"rap_min",&local_a09);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_a08);
  std::allocator<char>::~allocator((allocator<char> *)&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a30,"rap_max",&local_a31);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_a30);
  std::allocator<char>::~allocator((allocator<char> *)&local_a31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a58,"particle_monval",&local_a59);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  pvVar3 = operator_new(0x8b8);
  local_a99 = 1;
  std::__cxx11::string::string(local_a88,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_a99 = 0;
  local_a68 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19ea7d);
  std::__cxx11::string::~string(local_a88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"particle_monval",&local_ac1);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  pvVar3 = operator_new(0x8b8);
  local_b01 = 1;
  std::__cxx11::string::string(local_af0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_b01 = 0;
  local_ad0 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19ebad);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"particle_monval",&local_b29);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  pvVar3 = operator_new(0x8b8);
  local_b69 = 1;
  std::__cxx11::string::string(local_b58,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_b69 = 0;
  local_b38 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19ecdd);
  std::__cxx11::string::~string(local_b58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b90,"particle_monval",&local_b91);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_b90);
  std::allocator<char>::~allocator((allocator<char> *)&local_b91);
  pvVar3 = operator_new(0x8b8);
  local_bd1 = 1;
  std::__cxx11::string::string(local_bc0,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_bd1 = 0;
  local_ba0 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19ee0d);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf8,"particle_monval",&local_bf9);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  pvVar3 = operator_new(0x8b8);
  local_c39 = 1;
  std::__cxx11::string::string(local_c28,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_c39 = 0;
  local_c08 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19ef3d);
  std::__cxx11::string::~string(local_c28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c60,"particle_monval",&local_c61);
  ParameterReader::setVal
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0);
  std::__cxx11::string::~string(local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  pvVar3 = operator_new(0x8b8);
  local_ca1 = 1;
  std::__cxx11::string::string(local_c90,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
             (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
  singleParticleSpectra::singleParticleSpectra
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  local_ca1 = 0;
  local_c70 = pvVar3;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f06d);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc8,"resonance_weak_feed_down_flag",&local_cc9);
  dVar4 = ParameterReader::getVal
                    (in_stack_ffffffffffffe8e0,
                     (string *)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
  std::__cxx11::string::~string(local_cc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc9);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cf0,"particle_monval",&local_cf1);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_cf0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
    pvVar3 = operator_new(0x8b8);
    local_d31 = 1;
    std::__cxx11::string::string(local_d20,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_d31 = 0;
    local_d00 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f226);
    std::__cxx11::string::~string(local_d20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d58,"particle_monval",&local_d59);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_d58);
    std::allocator<char>::~allocator((allocator<char> *)&local_d59);
    pvVar3 = operator_new(0x8b8);
    local_d99 = 1;
    std::__cxx11::string::string(local_d88,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_d99 = 0;
    local_d68 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f356);
    std::__cxx11::string::~string(local_d88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_dc0,"particle_monval",&local_dc1);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_dc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_dc1);
    pvVar3 = operator_new(0x8b8);
    local_e01 = 1;
    std::__cxx11::string::string(local_df0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_e01 = 0;
    local_dd0 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f486);
    std::__cxx11::string::~string(local_df0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e28,"particle_monval",&local_e29);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_e28);
    std::allocator<char>::~allocator((allocator<char> *)&local_e29);
    pvVar3 = operator_new(0x8b8);
    local_e69 = 1;
    std::__cxx11::string::string(local_e58,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_e69 = 0;
    local_e38 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f5b6);
    std::__cxx11::string::~string(local_e58);
    in_stack_ffffffffffffe9d0 = (ParameterReader *)local_e91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_e91 + 1),"particle_monval",(allocator *)in_stack_ffffffffffffe9d0);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string((string *)(local_e91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e91);
    in_stack_ffffffffffffe9c8 = (string *)operator_new(0x8b8);
    local_ed1 = 1;
    std::__cxx11::string::string(local_ec0,in_RDI);
    in_stack_ffffffffffffe9c0 = local_ed0;
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_ed1 = 0;
    local_ea0 = in_stack_ffffffffffffe9c8;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f6e6);
    std::__cxx11::string::~string(local_ec0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ef8,"particle_monval",&local_ef9);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_ef8);
    std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
    in_stack_ffffffffffffe9b0 = (pretty_ostream *)operator_new(0x8b8);
    local_f39 = 1;
    std::__cxx11::string::string((string *)(local_f38 + 0x10),in_RDI);
    in_stack_ffffffffffffe9a8 = (string *)local_f38;
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_f39 = 0;
    local_f08 = in_stack_ffffffffffffe9b0;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f816);
    std::__cxx11::string::~string((string *)(local_f38 + 0x10));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f60,"particle_monval",&local_f61);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_f60);
    std::allocator<char>::~allocator((allocator<char> *)&local_f61);
    pvVar3 = operator_new(0x8b8);
    local_fa1 = 1;
    std::__cxx11::string::string(local_f90,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_fa1 = 0;
    local_f70 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19f946);
    std::__cxx11::string::~string(local_f90);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fc8,"collect_neutral_particles",&local_fc9);
  dVar4 = ParameterReader::getVal
                    (in_stack_ffffffffffffe8e8,(string *)in_stack_ffffffffffffe8e0,
                     (double)CONCAT44(in_stack_ffffffffffffe8dc,in_stack_ffffffffffffe8d8));
  std::__cxx11::string::~string(local_fc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
  if ((dVar4 == 1.0) && (!NAN(dVar4))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ff0,"particle_monval",&local_ff1);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_ff0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
    pvVar3 = operator_new(0x8b8);
    local_1031 = 1;
    std::__cxx11::string::string(local_1020,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_1031 = 0;
    local_1000 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1a0528);
    std::__cxx11::string::~string(local_1020);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1058,"particle_monval",&local_1059);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_1058);
    std::allocator<char>::~allocator((allocator<char> *)&local_1059);
    pvVar3 = operator_new(0x8b8);
    local_1099 = 1;
    std::__cxx11::string::string(local_1088,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_1099 = 0;
    local_1068 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1a0658);
    std::__cxx11::string::~string(local_1088);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_10c0,"particle_monval",&local_10c1);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_10c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
    pvVar3 = operator_new(0x8b8);
    local_1101 = 1;
    std::__cxx11::string::string(local_10f0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_1101 = 0;
    local_10d0 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1a0788);
    std::__cxx11::string::~string(local_10f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1128,"particle_monval",&local_1129);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_1128);
    std::allocator<char>::~allocator((allocator<char> *)&local_1129);
    pvVar3 = operator_new(0x8b8);
    local_1169 = 1;
    std::__cxx11::string::string(local_1158,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_1169 = 0;
    local_1138 = pvVar3;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1a08b8);
    std::__cxx11::string::~string(local_1158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1190,"particle_monval",&local_1191);
    ParameterReader::setVal
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,(double)in_stack_ffffffffffffe9c0
              );
    std::__cxx11::string::~string(local_1190);
    std::allocator<char>::~allocator((allocator<char> *)&local_1191);
    operator_new(0x8b8);
    local_11d1 = 1;
    std::__cxx11::string::string((string *)&stack0xffffffffffffee40,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe890,
               (shared_ptr<RandomUtil::Random> *)in_stack_ffffffffffffe888);
    singleParticleSpectra::singleParticleSpectra
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    local_11d1 = 0;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_ffffffffffffe890,(value_type *)in_stack_ffffffffffffe888);
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1a09e8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffee40);
  }
  local_11d8 = 0;
  while( true ) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a0db6);
    bVar1 = particleSamples::end_of_file(in_stack_ffffffffffffe888);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffe890,(char (*) [16])in_stack_ffffffffffffe888)
    ;
    local_11dc = local_11d8 + 1;
    this_00 = pretty_ostream::operator<<
                        ((pretty_ostream *)in_stack_ffffffffffffe890,
                         (int *)in_stack_ffffffffffffe888);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffe890,(char (*) [6])in_stack_ffffffffffffe888);
    message = (string *)local_1201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1201 + 1),"info",(allocator *)message);
    pretty_ostream::flush(in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
    std::__cxx11::string::~string((string *)(local_1201 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1201);
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a0eab);
    local_1208 = particleSamples::read_in_particle_samples
                           ((particleSamples *)in_stack_ffffffffffffe890);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffe890,(char (*) [7])in_stack_ffffffffffffe888);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_ffffffffffffe890,(int *)in_stack_ffffffffffffe888);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1228,"info",&local_1229);
    pretty_ostream::flush(in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
    std::__cxx11::string::~string(local_1228);
    std::allocator<char>::~allocator((allocator<char> *)&local_1229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1250," processing ...",&local_1251);
    pretty_ostream::info(this_00,message);
    std::__cxx11::string::~string(local_1250);
    std::allocator<char>::~allocator((allocator<char> *)&local_1251);
    local_1260 = local_108;
    local_1290.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
                  begin((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *
                        )in_stack_ffffffffffffe888);
    local_1290.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::
                  end((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                      in_stack_ffffffffffffe888);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)in_stack_ffffffffffffe890,
                         (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)in_stack_ffffffffffffe888);
      if (!bVar1) break;
      local_1290.values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)__gnu_cxx::
                    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                    ::operator*((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                                 *)&local_1290.values.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      local_1290.names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           singleParticleSpectra::get_monval
                     ((singleParticleSpectra *)
                      *local_1290.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start);
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1a106e);
      particleSamples::filter_particles_from_events
                ((particleSamples *)in_stack_ffffffffffffe890,
                 (int)((ulong)in_stack_ffffffffffffe888 >> 0x20));
      in_stack_ffffffffffffe8a0 = &local_1290;
      std::shared_ptr<particleSamples>::shared_ptr
                ((shared_ptr<particleSamples> *)in_stack_ffffffffffffe890,
                 (shared_ptr<particleSamples> *)in_stack_ffffffffffffe888);
      singleParticleSpectra::calculate_Qn_vector_shell
                (in_stack_ffffffffffffee48,in_stack_ffffffffffffee40);
      std::shared_ptr<particleSamples>::~shared_ptr((shared_ptr<particleSamples> *)0x1a10cb);
      __gnu_cxx::
      __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
      ::operator++((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                    *)&local_1290.values.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    }
    in_stack_ffffffffffffe888 = (particleSamples *)(in_RDI + 0x70);
    in_stack_ffffffffffffe890 = (singleParticleSpectra *)&local_12b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_12b0,"done!",(allocator *)in_stack_ffffffffffffe890);
    pretty_ostream::info(this_00,message);
    std::__cxx11::string::~string(local_12b0);
    std::allocator<char>::~allocator(&local_12b1);
    local_11d8 = local_1208 + local_11d8;
  }
  local_12c0 = local_108;
  local_12c8._M_current =
       (singleParticleSpectra **)
       std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::begin
                 ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                  in_stack_ffffffffffffe888);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::end
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe888);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)in_stack_ffffffffffffe890,
                       (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)in_stack_ffffffffffffe888);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator*(&local_12c8);
    singleParticleSpectra::output_spectra_and_Qn_results(in_stack_ffffffffffffe890);
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator++(&local_12c8);
  }
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::clear
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x1a1345);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::~vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_ffffffffffffe8a0);
  ParameterReader::~ParameterReader((ParameterReader *)in_stack_ffffffffffffe890);
  return;
}

Assistant:

void Analysis::FlowAnalysis_RHIC() {
    ParameterReader paraRdr = paraRdr_;
    int compute_correlation = paraRdr.getVal("compute_correlation");
    if (compute_correlation == 1) paraRdr.setVal("compute_correlation", 0);
    int flag_charge_dependence = paraRdr.getVal("flag_charge_dependence");
    if (flag_charge_dependence == 1)
        paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // speical triggers follows
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // STAR rapidity cut
    paraRdr.setVal("rap_min", -1.0);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 1.0);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    // PHENIX BBC
    paraRdr.setVal("rap_min", -3.9);
    paraRdr.setVal("rap_max", -3.1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 3.1);
    paraRdr.setVal("rap_max", 3.9);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    if (paraRdr.getVal("pidwithRapidityPTDistribution", 0) == 1) {
        paraRdr.setVal("rapidityPTDistributionFlag", 1);
        paraRdr.setVal("rap_type", 1);
        paraRdr.setVal("particle_monval", 211);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -211);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 321);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -321);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2212);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2212);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }
    if (paraRdr.getVal("collect_neutral_particles", 0) == 1) {
        paraRdr.setVal("particle_monval", 111);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -311);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -2112);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}